

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  long lVar1;
  sqlite3 *psVar2;
  int iVar3;
  int op;
  int p1;
  int p2;
  int iVar4;
  int iVar5;
  Table *pTVar6;
  Index *pIVar7;
  Vdbe *p;
  int in_ECX;
  long in_RDX;
  char *pcVar8;
  undefined8 *in_RSI;
  Parse *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int reg3;
  int reg2;
  int reg1;
  int fileFormat;
  int addr1;
  char *zDb_1;
  char *zDb;
  int iDb;
  Vdbe *v;
  sqlite3 *db;
  char *zName;
  Table *pTable;
  Token *pName;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar10;
  undefined8 in_stack_ffffffffffffff90;
  sqlite3 *db_00;
  Parse *pParse_00;
  uint local_5c;
  char *local_48;
  undefined8 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = in_RDI->db;
  local_10 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
  if (((psVar2->init).busy == '\0') || ((psVar2->init).newTnum != 1)) {
    local_5c = sqlite3TwoPartName((Parse *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88),
                                  (Token *)CONCAT44(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80),
                                  (Token *)CONCAT44(in_stack_ffffffffffffff7c,
                                                    in_stack_ffffffffffffff78),
                                  (Token **)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if ((int)local_5c < 0) goto LAB_001acdb9;
    if (((in_ECX != 0) && (*(int *)(in_RDX + 8) != 0)) && (local_5c != 1)) {
      sqlite3ErrorMsg(in_RDI,"temporary table name must be unqualified");
      goto LAB_001acdb9;
    }
    if (in_ECX != 0) {
      local_5c = 1;
    }
    local_48 = sqlite3NameFromToken
                         ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (Token *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (1 < in_RDI->eParseMode) {
      sqlite3RenameTokenMap
                ((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (Token *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
  }
  else {
    local_5c = (uint)(psVar2->init).iDb;
    local_48 = sqlite3DbStrDup((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
    local_10 = in_RSI;
  }
  (in_RDI->sNameToken).z = (char *)*local_10;
  *(undefined8 *)&(in_RDI->sNameToken).n = local_10[1];
  if (local_48 == (char *)0x0) goto LAB_001acdb9;
  iVar3 = sqlite3CheckObjectName
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (iVar3 == 0) {
    pParse_00 = (Parse *)psVar2->aDb[(int)local_5c].zDbSName;
    iVar3 = sqlite3AuthCheck(pParse_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if ((iVar3 == 0) &&
       ((in_R9D != 0 ||
        (iVar3 = sqlite3AuthCheck(pParse_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                  (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88),
                                  (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                   in_stack_ffffffffffffff80),
                                  (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78)), iVar3 == 0)))) {
      iVar3 = (int)in_stack_ffffffffffffff90;
      if (in_RDI->eParseMode == '\0') {
        db_00 = (sqlite3 *)psVar2->aDb[(int)local_5c].zDbSName;
        iVar3 = sqlite3ReadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70));
        if (iVar3 == 0) {
          pTVar6 = sqlite3FindTable((sqlite3 *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80),
                                    (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78));
          if (pTVar6 == (Table *)0x0) {
            pIVar7 = sqlite3FindIndex(db_00,(char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                             in_stack_ffffffffffffff88),
                                      (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80));
            iVar3 = (int)db_00;
            if (pIVar7 == (Index *)0x0) goto LAB_001aca8f;
            sqlite3ErrorMsg(in_RDI,"there is already an index named %s",local_48);
          }
          else if (in_stack_00000008 == 0) {
            pcVar8 = "table";
            if (pTVar6->eTabType == '\x02') {
              pcVar8 = "view";
            }
            sqlite3ErrorMsg(in_RDI,"%s %T already exists",pcVar8,local_10);
          }
          else {
            sqlite3CodeVerifySchema
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
            sqlite3ForceNotReadOnly
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          }
        }
      }
      else {
LAB_001aca8f:
        pTVar6 = (Table *)sqlite3DbMallocZero((sqlite3 *)
                                              CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70),
                                              CONCAT44(in_stack_ffffffffffffff6c,
                                                       in_stack_ffffffffffffff68));
        if (pTVar6 != (Table *)0x0) {
          pTVar6->zName = local_48;
          pTVar6->iPKey = -1;
          pTVar6->pSchema = psVar2->aDb[(int)local_5c].pSchema;
          pTVar6->nTabRef = 1;
          pTVar6->nRowLogEst = 200;
          in_RDI->pNewTable = pTVar6;
          if (((psVar2->init).busy == '\0') &&
             (p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68)), p != (Vdbe *)0x0)) {
            uVar10 = 0xaaaaaaaa;
            uVar9 = 0xaaaaaaaa;
            sqlite3BeginWriteOperation
                      ((Parse *)&DAT_aaaaaaaaaaaaaaaa,-0x55555556,in_stack_ffffffffffffff78);
            if (in_R9D != 0) {
              sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c);
            }
            op = in_RDI->nMem + 1;
            in_RDI->nMem = op;
            in_RDI->regRowid = op;
            p1 = in_RDI->nMem + 1;
            in_RDI->nMem = p1;
            in_RDI->regRoot = p1;
            p2 = in_RDI->nMem + 1;
            in_RDI->nMem = p2;
            sqlite3VdbeAddOp3((Vdbe *)CONCAT44(uVar10,uVar9),op,p1,p2,in_stack_ffffffffffffff78);
            sqlite3VdbeUsesBtree
                      ((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
            iVar4 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
            uVar9 = 4;
            if ((psVar2->flags & 2) != 0) {
              uVar9 = 1;
            }
            sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,uVar9),op,p1,p2,in_stack_ffffffffffffff78);
            sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,uVar9),op,p1,p2,in_stack_ffffffffffffff78);
            sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c);
            if ((in_R8D == 0) && (in_R9D == 0)) {
              iVar5 = sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,uVar9),op,p1,p2,
                                        in_stack_ffffffffffffff78);
              (in_RDI->u1).addrCrTab = iVar5;
            }
            else {
              sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c,
                                in_stack_ffffffffffffff68,0);
            }
            sqlite3OpenSchemaTable
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
            sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,p1),p2,in_stack_ffffffffffffff78,
                              in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                              (char *)CONCAT44(in_stack_ffffffffffffff6c,0xffffffff),iVar3);
            sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar4,uVar9),op,p1,p2,in_stack_ffffffffffffff78);
            sqlite3VdbeChangeP5(p,8);
            sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
          }
          goto LAB_001acdb9;
        }
        in_RDI->rc = 7;
        in_RDI->nErr = in_RDI->nErr + 1;
      }
    }
  }
  in_RDI->checkSchema = '\x01';
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
LAB_001acdb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  if( db->init.busy && db->init.newTnum==1 ){
    /* Special case:  Parsing the sqlite_schema or sqlite_temp_schema schema */
    iDb = db->init.iDb;
    zName = sqlite3DbStrDup(db, SCHEMA_TABLE(iDb));
    pName = pName1;
  }else{
    /* The common case */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) return;
    if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
      /* If creating a temp table, the name may not be qualified. Unless
      ** the database name is "temp" anyway.  */
      sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
      return;
    }
    if( !OMIT_TEMPDB && isTemp ) iDb = 1;
    zName = sqlite3NameFromToken(db, pName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)zName, pName);
    }
  }
  pParse->sNameToken = *pName;
  if( zName==0 ) return;
  if( sqlite3CheckObjectName(pParse, zName, isView?"view":"table", zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( isTemp==0 || isTemp==1 );
  assert( isView==0 || isView==1 );
  {
    static const u8 aCode[] = {
       SQLITE_CREATE_TABLE,
       SQLITE_CREATE_TEMP_TABLE,
       SQLITE_CREATE_VIEW,
       SQLITE_CREATE_TEMP_VIEW
    };
    char *zDb = db->aDb[iDb].zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, (int)aCode[isTemp+2*isView],
                                       zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_SPECIAL_PARSE ){
    char *zDb = db->aDb[iDb].zDbSName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "%s %T already exists",
                        (IsView(pTable)? "view" : "table"), pName);
      }else{
        assert( !db->init.busy || CORRUPT_DB );
        sqlite3CodeVerifySchema(pParse, iDb);
        sqlite3ForceNotReadOnly(pParse);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    assert( db->mallocFailed );
    pParse->rc = SQLITE_NOMEM_BKPT;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nTabRef = 1;
#ifdef SQLITE_DEFAULT_ROWEST
  pTable->nRowLogEst = sqlite3LogEst(SQLITE_DEFAULT_ROWEST);
#else
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
#endif
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* Begin generating the code that will insert the table record into
  ** the schema table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int addr1;
    int fileFormat;
    int reg1, reg2, reg3;
    /* nullRow[] is an OP_Record encoding of a row containing 5 NULLs */
    static const char nullRow[] = { 6, 0, 0, 0, 0, 0 };
    sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set,
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    addr1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, fileFormat);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, ENC(db));
    sqlite3VdbeJumpHere(v, addr1);

    /* This just creates a place-holder record in the sqlite_schema table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      assert( !pParse->bReturning );
      pParse->u1.addrCrTab =
         sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, reg2, BTREE_INTKEY);
    }
    sqlite3OpenSchemaTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp4(v, OP_Blob, 6, reg3, 0, nullRow, P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  pParse->checkSchema = 1;
  sqlite3DbFree(db, zName);
  return;
}